

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosPluginManager.cpp
# Opt level: O2

OperatorCreateFun * __thiscall
adios2::plugin::PluginManager::GetOperatorCreateFun
          (OperatorCreateFun *__return_storage_ptr__,PluginManager *this,string *name)

{
  iterator iVar1;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>_>_>
          ::find(&((this->m_Impl)._M_t.
                   super___uniq_ptr_impl<adios2::plugin::PluginManager::Impl,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_adios2::plugin::PluginManager::Impl_*,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
                   .super__Head_base<0UL,_adios2::plugin::PluginManager::Impl_*,_false>._M_head_impl
                  )->m_OperatorRegistry,name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"Plugins",&local_99);
    std::__cxx11::string::string((string *)&local_58,"PluginManager",&local_9a);
    std::__cxx11::string::string((string *)&local_78,"GetOperatorCreateFun",&local_9b);
    std::operator+(&local_98,"Couldn\'t find operator plugin named ",name);
    helper::Throw<std::runtime_error>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::
  function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::function(__return_storage_ptr__,
             (function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
              *)((long)iVar1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_true>
                       ._M_cur + 0x50));
  return __return_storage_ptr__;
}

Assistant:

PluginManager::OperatorCreateFun PluginManager::GetOperatorCreateFun(const std::string &name)
{
    auto pluginIt = m_Impl->m_OperatorRegistry.find(name);
    if (pluginIt == m_Impl->m_OperatorRegistry.end())
    {
        helper::Throw<std::runtime_error>("Plugins", "PluginManager", "GetOperatorCreateFun",
                                          "Couldn't find operator plugin named " + name);
    }

    return pluginIt->second.m_HandleCreate;
}